

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

void __thiscall QDateTime::setSecsSinceEpoch(QDateTime *this,qint64 secs)

{
  StatusFlags *pSVar1;
  QDateTimePrivate *pQVar2;
  undefined8 uVar3;
  QDateTimePrivate *pQVar4;
  
  if (SEXT816(secs * 1000) != SEXT816(secs) * SEXT416(1000)) {
    pQVar2 = (this->d).d;
    if (((ulong)pQVar2 & 1) == 0) {
      if ((__int_type_conflict)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        pQVar4 = (QDateTimePrivate *)operator_new(0x20);
        (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> = (__atomic_base<int>)0x0;
        uVar3 = *(undefined8 *)((long)&pQVar2->m_msecs + 4);
        *(undefined8 *)&pQVar4->m_status = *(undefined8 *)&pQVar2->m_status;
        *(undefined8 *)((long)&pQVar4->m_msecs + 4) = uVar3;
        QTimeZone::QTimeZone(&pQVar4->m_timeZone,&pQVar2->m_timeZone);
        (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> = (__atomic_base<int>)0x1;
        pQVar2 = (this->d).d;
        LOCK();
        (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)
              (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if (((__int_type_conflict)
             (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
           (pQVar2 = (this->d).d, pQVar2 != (QDateTimePrivate *)0x0)) {
          QTimeZone::~QTimeZone(&pQVar2->m_timeZone);
          operator_delete(pQVar2,0x20);
        }
        (this->d).d = pQVar4;
      }
      pSVar1 = &((this->d).d)->m_status;
      (pSVar1->super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>).
      super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
           (pSVar1->super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>).
           super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i & 0xfffffff1;
    }
    else {
      *(byte *)&this->d = *(byte *)&this->d & 0xf1;
    }
    return;
  }
  setMSecsSinceEpoch(this,secs * 1000);
  return;
}

Assistant:

void QDateTime::setSecsSinceEpoch(qint64 secs)
{
    qint64 msecs;
    if (!qMulOverflow(secs, std::integral_constant<qint64, MSECS_PER_SEC>(), &msecs))
        setMSecsSinceEpoch(msecs);
    else
        d.invalidate();
}